

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_1440904::BIP32PubkeyProvider::GetPubKey
          (BIP32PubkeyProvider *this,int pos,SigningProvider *arg,CPubKey *key_out,
          KeyOriginInfo *final_info_out,DescriptorCache *read_cache,DescriptorCache *write_cache)

{
  uint *puVar1;
  undefined4 uVar2;
  bool bVar3;
  bool bVar4;
  DeriveType DVar5;
  uchar auVar6 [4];
  const_iterator cVar7;
  uint *puVar8;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  long lVar11;
  undefined4 *puVar12;
  undefined4 *puVar13;
  CExtPubKey *pCVar14;
  CExtPubKey *pCVar15;
  uint *puVar16;
  byte bVar17;
  const_iterator __end4;
  long in_FS_OFFSET;
  byte bVar18;
  KeyOriginInfo final_info_out_tmp;
  KeyOriginInfo parent_info;
  CExtPubKey parent_extkey;
  CExtPubKey final_extkey;
  CKeyID keyid;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2e8;
  uchar local_2d0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2c8;
  CExtPubKey local_2ac;
  undefined1 local_238 [56];
  __uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  local_200;
  undefined1 local_1f8 [56];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_1c0;
  uchar local_1b8 [8];
  uchar auStack_1b0 [8];
  uchar local_1a8 [8];
  uchar auStack_1a0 [8];
  uchar local_198 [8];
  uchar auStack_190 [8];
  uchar local_188 [8];
  undefined8 uStack_180;
  undefined8 local_168;
  uchar uStack_160;
  undefined3 uStack_15f;
  uint uStack_15c;
  uchar local_158 [36];
  CExtPubKey local_134;
  CExtPubKey local_c0;
  CKeyID local_4c;
  long local_38;
  
  bVar18 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CPubKey::GetID(&local_4c,(CPubKey *)&this->field_0x3c);
  local_2d0[0] = local_4c.super_uint160.super_base_blob<160U>.m_data._M_elems[0];
  local_2d0[1] = local_4c.super_uint160.super_base_blob<160U>.m_data._M_elems[1];
  local_2d0[2] = local_4c.super_uint160.super_base_blob<160U>.m_data._M_elems[2];
  local_2d0[3] = local_4c.super_uint160.super_base_blob<160U>.m_data._M_elems[3];
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&local_2c8,&this->m_path);
  uVar2 = local_2d0._0_4_;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_2e8,&local_2c8);
  DVar5 = this->m_derive;
  if (DVar5 == UNHARDENED) {
    local_c0.version = (uchar  [4])pos;
    if (local_2e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_2e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_2e8,
                 (iterator)
                 local_2e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)&local_c0);
      DVar5 = this->m_derive;
    }
    else {
      *local_2e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = pos;
      local_2e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_2e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      DVar5 = UNHARDENED;
    }
  }
  if (DVar5 == HARDENED) {
    auVar6 = (uchar  [4])(pos | 0x80000000);
    local_c0.version[0] = auVar6[0];
    local_c0.version[1] = auVar6[1];
    local_c0.version[2] = auVar6[2];
    local_c0.version[3] = auVar6[3];
    if (local_2e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_2e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_2e8,
                 (iterator)
                 local_2e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)&local_c0);
    }
    else {
      *local_2e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = (uint)auVar6;
      local_2e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_2e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  puVar13 = (undefined4 *)&(this->super_PubkeyProvider).field_0xc;
  puVar12 = puVar13;
  pCVar14 = &local_c0;
  for (lVar11 = 0x1d; lVar11 != 0; lVar11 = lVar11 + -1) {
    *(undefined4 *)pCVar14->version = *puVar12;
    puVar12 = puVar12 + (ulong)bVar18 * -2 + 1;
    pCVar14 = (CExtPubKey *)((long)pCVar14 + ((ulong)bVar18 * -2 + 1) * 4);
  }
  pCVar14 = &local_134;
  for (lVar11 = 0x1d; lVar11 != 0; lVar11 = lVar11 + -1) {
    *(undefined4 *)pCVar14->version = *puVar13;
    puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
    pCVar14 = (CExtPubKey *)((long)pCVar14 + ((ulong)bVar18 * -2 + 1) * 4);
  }
  local_158[0] = '\0';
  local_158[1] = '\0';
  local_158[2] = '\0';
  local_158[3] = '\0';
  local_158[4] = '\0';
  local_158[5] = '\0';
  local_158[6] = '\0';
  local_158[7] = '\0';
  local_158[8] = '\0';
  local_158[9] = '\0';
  local_158[10] = '\0';
  local_158[0xb] = '\0';
  local_158[0xc] = '\0';
  local_158[0xd] = '\0';
  local_158[0xe] = '\0';
  local_158[0xf] = '\0';
  local_158[0x10] = '\0';
  local_158[0x11] = '\0';
  local_158[0x12] = '\0';
  local_158[0x13] = '\0';
  local_158[0x14] = '\0';
  local_158[0x15] = '\0';
  local_158[0x16] = '\0';
  local_158[0x17] = '\0';
  local_158[0x18] = '\0';
  local_158[0x19] = '\0';
  local_158[0x1a] = '\0';
  local_158[0x1b] = '\0';
  local_158[0x1c] = '\0';
  local_158[0x1d] = '\0';
  local_158[0x1e] = '\0';
  local_158[0x1f] = '\0';
  if (read_cache == (DescriptorCache *)0x0) {
    DVar5 = this->m_derive;
    if (DVar5 == HARDENED) {
LAB_0038ff89:
      local_1f8[0x1c] = '\0';
      local_1f8[0x1d] = '\0';
      local_1f8[0x1e] = '\0';
      local_1f8[0x1f] = '\0';
      local_1f8[0x20] = '\0';
      local_1f8[0x21] = '\0';
      local_1f8[0x22] = '\0';
      local_1f8[0x23] = '\0';
      local_1f8[0x24] = '\0';
      local_1f8[0x25] = '\0';
      local_1f8[0x26] = '\0';
      local_1f8[0x27] = '\0';
      local_1f8[0x28] = '\0';
      local_1f8[0x29] = '\0';
      local_1f8[0x2a] = '\0';
      local_1f8[0x2b] = '\0';
      local_1f8[0xc] = '\0';
      local_1f8[0xd] = '\0';
      local_1f8[0xe] = '\0';
      local_1f8[0xf] = '\0';
      local_1f8[0x10] = '\0';
      local_1f8[0x11] = '\0';
      local_1f8[0x12] = '\0';
      local_1f8[0x13] = '\0';
      local_1f8[0x14] = '\0';
      local_1f8[0x15] = '\0';
      local_1f8[0x16] = '\0';
      local_1f8[0x17] = '\0';
      local_1f8[0x18] = '\0';
      local_1f8[0x19] = '\0';
      local_1f8[0x1a] = '\0';
      local_1f8[0x1b] = '\0';
      local_1f8[0x30] = false;
      local_1c0._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
      local_238[0x1c] = '\0';
      local_238[0x1d] = '\0';
      local_238[0x1e] = '\0';
      local_238[0x1f] = '\0';
      local_238[0x20] = '\0';
      local_238[0x21] = '\0';
      local_238[0x22] = '\0';
      local_238[0x23] = '\0';
      local_238[0x24] = '\0';
      local_238[0x25] = '\0';
      local_238[0x26] = '\0';
      local_238[0x27] = '\0';
      local_238[0x28] = '\0';
      local_238[0x29] = '\0';
      local_238[0x2a] = '\0';
      local_238[0x2b] = '\0';
      local_238[0xc] = '\0';
      local_238[0xd] = '\0';
      local_238[0xe] = '\0';
      local_238[0xf] = '\0';
      local_238[0x10] = '\0';
      local_238[0x11] = '\0';
      local_238[0x12] = '\0';
      local_238[0x13] = '\0';
      local_238[0x14] = '\0';
      local_238[0x15] = '\0';
      local_238[0x16] = '\0';
      local_238[0x17] = '\0';
      local_238[0x18] = '\0';
      local_238[0x19] = '\0';
      local_238[0x1a] = '\0';
      local_238[0x1b] = '\0';
      local_238[0x30] = false;
      local_200._M_t.
      super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
           (tuple<std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            )(_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
              )0x0;
      bVar4 = GetDerivedExtKey(this,arg,(CExtKey *)local_1f8,(CExtKey *)local_238);
      if (bVar4) {
        CExtKey::Neuter(&local_2ac,(CExtKey *)local_1f8);
        pCVar14 = &local_2ac;
        pCVar15 = &local_134;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          *(undefined4 *)pCVar15->version = *(undefined4 *)pCVar14->version;
          pCVar14 = (CExtPubKey *)((long)pCVar14 + ((ulong)bVar18 * -2 + 1) * 4);
          pCVar15 = (CExtPubKey *)((long)pCVar15 + ((ulong)bVar18 * -2 + 1) * 4);
        }
        local_134.pubkey.vch[0x40] = local_2ac.pubkey.vch[0x40];
        DVar5 = this->m_derive;
        bVar3 = true;
        if (DVar5 == UNHARDENED) {
          bVar3 = CExtKey::Derive((CExtKey *)local_1f8,(CExtKey *)local_1f8,pos);
          DVar5 = this->m_derive;
        }
        if (DVar5 == HARDENED) {
          bVar3 = CExtKey::Derive((CExtKey *)local_1f8,(CExtKey *)local_1f8,pos | 0x80000000);
        }
        CExtKey::Neuter(&local_2ac,(CExtKey *)local_1f8);
        pCVar14 = &local_2ac;
        pCVar15 = &local_c0;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          *(undefined4 *)pCVar15->version = *(undefined4 *)pCVar14->version;
          pCVar14 = (CExtPubKey *)((long)pCVar14 + ((ulong)bVar18 * -2 + 1) * 4);
          pCVar15 = (CExtPubKey *)((long)pCVar15 + ((ulong)bVar18 * -2 + 1) * 4);
        }
        local_c0.pubkey.vch[0x40] = local_2ac.pubkey.vch[0x40];
        if (local_200._M_t.
            super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
            (_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             )0x0) {
          CExtKey::Neuter(&local_2ac,(CExtKey *)local_238);
          local_168 = CONCAT44(local_2ac._4_4_,local_2ac.version);
          local_158[0x10] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[0x10];
          local_158[0x11] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[0x11];
          local_158[0x12] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[0x12];
          local_158[0x13] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[0x13];
          local_158[0x14] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[0x14];
          local_158[0x15] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[0x15];
          local_158[0x16] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[0x16];
          local_158[0x17] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[0x17];
          local_158[0x18] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[0x18];
          local_158[0x19] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[0x19];
          local_158[0x1a] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[0x1a];
          local_158[0x1b] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[0x1b];
          local_158[0x1c] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[0x1c];
          local_158[0x1d] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[0x1d];
          local_158[0x1e] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[0x1e];
          local_158[0x1f] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[0x1f];
          local_158[0] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[0];
          local_158[1] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[1];
          local_158[2] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[2];
          local_158[3] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[3];
          local_158[4] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[4];
          local_158[5] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[5];
          local_158[6] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[6];
          local_158[7] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[7];
          local_158[8] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[8];
          local_158[9] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[9];
          local_158[10] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[10];
          local_158[0xb] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[0xb];
          local_158[0xc] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[0xc];
          local_158[0xd] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[0xd];
          local_158[0xe] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[0xe];
          local_158[0xf] = local_2ac.chaincode.super_base_blob<256U>.m_data._M_elems[0xf];
          uStack_160 = local_2ac.vchFingerprint[3];
          uStack_15f = local_2ac._9_3_;
          uStack_15c = local_2ac.nChild;
          local_1b8[0] = local_2ac.pubkey.vch[1];
          local_1b8[1] = local_2ac.pubkey.vch[2];
          local_1b8[2] = local_2ac.pubkey.vch[3];
          local_1b8[3] = local_2ac.pubkey.vch[4];
          local_1b8[4] = local_2ac.pubkey.vch[5];
          local_1b8[5] = local_2ac.pubkey.vch[6];
          local_1b8[6] = local_2ac.pubkey.vch[7];
          local_1b8[7] = local_2ac.pubkey.vch[8];
          auStack_1b0[0] = local_2ac.pubkey.vch[9];
          auStack_1b0[1] = local_2ac.pubkey.vch[10];
          auStack_1b0[2] = local_2ac.pubkey.vch[0xb];
          auStack_1b0[3] = local_2ac.pubkey.vch[0xc];
          auStack_1b0[4] = local_2ac.pubkey.vch[0xd];
          auStack_1b0[5] = local_2ac.pubkey.vch[0xe];
          auStack_1b0[6] = local_2ac.pubkey.vch[0xf];
          auStack_1b0[7] = local_2ac.pubkey.vch[0x10];
          local_1a8[0] = local_2ac.pubkey.vch[0x11];
          local_1a8[1] = local_2ac.pubkey.vch[0x12];
          local_1a8[2] = local_2ac.pubkey.vch[0x13];
          local_1a8[3] = local_2ac.pubkey.vch[0x14];
          local_1a8[4] = local_2ac.pubkey.vch[0x15];
          local_1a8[5] = local_2ac.pubkey.vch[0x16];
          local_1a8[6] = local_2ac.pubkey.vch[0x17];
          local_1a8[7] = local_2ac.pubkey.vch[0x18];
          auStack_1a0[0] = local_2ac.pubkey.vch[0x19];
          auStack_1a0[1] = local_2ac.pubkey.vch[0x1a];
          auStack_1a0[2] = local_2ac.pubkey.vch[0x1b];
          auStack_1a0[3] = local_2ac.pubkey.vch[0x1c];
          auStack_1a0[4] = local_2ac.pubkey.vch[0x1d];
          auStack_1a0[5] = local_2ac.pubkey.vch[0x1e];
          auStack_1a0[6] = local_2ac.pubkey.vch[0x1f];
          auStack_1a0[7] = local_2ac.pubkey.vch[0x20];
          local_198[0] = local_2ac.pubkey.vch[0x21];
          local_198[1] = local_2ac.pubkey.vch[0x22];
          local_198[2] = local_2ac.pubkey.vch[0x23];
          local_198[3] = local_2ac.pubkey.vch[0x24];
          local_198[4] = local_2ac.pubkey.vch[0x25];
          local_198[5] = local_2ac.pubkey.vch[0x26];
          local_198[6] = local_2ac.pubkey.vch[0x27];
          local_198[7] = local_2ac.pubkey.vch[0x28];
          auStack_190[0] = local_2ac.pubkey.vch[0x29];
          auStack_190[1] = local_2ac.pubkey.vch[0x2a];
          auStack_190[2] = local_2ac.pubkey.vch[0x2b];
          auStack_190[3] = local_2ac.pubkey.vch[0x2c];
          auStack_190[4] = local_2ac.pubkey.vch[0x2d];
          auStack_190[5] = local_2ac.pubkey.vch[0x2e];
          auStack_190[6] = local_2ac.pubkey.vch[0x2f];
          auStack_190[7] = local_2ac.pubkey.vch[0x30];
          uStack_180 = CONCAT17(local_2ac.pubkey.vch[0x40],local_2ac.pubkey.vch._57_7_);
          local_188[0] = local_2ac.pubkey.vch[0x31];
          local_188[1] = local_2ac.pubkey.vch[0x32];
          local_188[2] = local_2ac.pubkey.vch[0x33];
          local_188[3] = local_2ac.pubkey.vch[0x34];
          local_188[4] = local_2ac.pubkey.vch[0x35];
          local_188[5] = local_2ac.pubkey.vch[0x36];
          local_188[6] = local_2ac.pubkey.vch[0x37];
          local_188[7] = local_2ac.pubkey.vch[0x38];
          bVar17 = local_2ac.pubkey.vch[0];
          goto LAB_00390208;
        }
        bVar17 = 0xff;
      }
      else {
        bVar3 = true;
        bVar17 = 0xff;
LAB_00390208:
        if ((_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             )local_200._M_t.
              super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
              .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
            (array<unsigned_char,_32UL> *)0x0) {
          SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                    ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_200,
                     (array<unsigned_char,_32UL> *)
                     local_200._M_t.
                     super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                     .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl);
        }
      }
      if (local_1c0._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
        SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                  ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_1c0,
                   local_1c0._M_head_impl);
      }
      if (!bVar4) goto LAB_003902f3;
    }
    else {
      puVar16 = (this->m_path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar1 = (this->m_path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      puVar8 = puVar16;
      if (puVar16 != puVar1) {
        do {
          if ((int)*puVar8 < 0) goto LAB_0038ff89;
          puVar8 = puVar8 + 1;
        } while (puVar8 != puVar1);
        if (puVar16 != puVar1) {
          do {
            bVar3 = CExtPubKey::Derive(&local_134,&local_134,*puVar16);
            if (!bVar3) goto LAB_003902f3;
            puVar16 = puVar16 + 1;
          } while (puVar16 != puVar1);
          DVar5 = this->m_derive;
        }
      }
      pCVar14 = &local_134;
      pCVar15 = &local_c0;
      for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
        *(undefined4 *)pCVar15->version = *(undefined4 *)pCVar14->version;
        pCVar14 = (CExtPubKey *)((long)pCVar14 + ((ulong)bVar18 * -2 + 1) * 4);
        pCVar15 = (CExtPubKey *)((long)pCVar15 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      local_c0.pubkey.vch[0x40] = local_134.pubkey.vch[0x40];
      bVar3 = true;
      if (DVar5 == UNHARDENED) {
        bVar3 = CExtPubKey::Derive(&local_134,&local_c0,pos);
        DVar5 = this->m_derive;
      }
      bVar17 = 0xff;
      if (DVar5 == HARDENED) {
        __assert_fail("m_derive != DeriveType::HARDENED",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/descriptor.cpp"
                      ,0x1bf,
                      "virtual bool (anonymous namespace)::BIP32PubkeyProvider::GetPubKey(int, const SigningProvider &, CPubKey &, KeyOriginInfo &, const DescriptorCache *, DescriptorCache *) const"
                     );
      }
    }
LAB_0039024a:
    if (bVar3 == false) {
LAB_003902f3:
      bVar3 = false;
      goto LAB_003903b4;
    }
  }
  else {
    bVar3 = DescriptorCache::GetCachedDerivedExtPubKey
                      (read_cache,(this->super_PubkeyProvider).m_expr_index,pos,&local_c0);
    bVar17 = 0xff;
    if (!bVar3) {
      if (this->m_derive != HARDENED) {
        local_2ac.version = (uchar  [4])(this->super_PubkeyProvider).m_expr_index;
        cVar7 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(read_cache->m_parent_xpubs)._M_h,(key_type_conflict *)&local_2ac);
        if (cVar7.super__Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false>._M_cur
            != (__node_type *)0x0) {
          puVar13 = (undefined4 *)
                    ((long)cVar7.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false>
                           ._M_cur + 0xc);
          pCVar14 = &local_134;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            *(undefined4 *)pCVar14->version = *puVar13;
            puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
            pCVar14 = (CExtPubKey *)((long)pCVar14 + ((ulong)bVar18 * -2 + 1) * 4);
          }
          local_134.pubkey.vch[0x40] =
               *(uchar *)((long)cVar7.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false>
                                ._M_cur + 0x7c);
          memmove(&local_c0,
                  (undefined4 *)
                  ((long)cVar7.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false>
                         ._M_cur + 0xc),0x71);
          if (this->m_derive == UNHARDENED) {
            bVar3 = CExtPubKey::Derive(&local_134,&local_c0,pos);
            bVar17 = 0xff;
            goto LAB_0039024a;
          }
          goto LAB_00390253;
        }
      }
      goto LAB_003902f3;
    }
  }
LAB_00390253:
  *(undefined4 *)final_info_out->fingerprint = uVar2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&final_info_out->path,&local_2e8);
  memcpy(key_out,&local_c0.pubkey,0x41);
  bVar3 = true;
  if (write_cache != (DescriptorCache *)0x0) {
    if (this->m_derive == HARDENED) {
      if ((final_info_out->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (final_info_out->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_2ac.version = (uchar  [4])(this->super_PubkeyProvider).m_expr_index;
        local_1f8._0_4_ = pos;
        this_00 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)write_cache,(key_type *)&local_2ac);
        pmVar9 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[](this_00,(key_type *)local_1f8);
        pCVar14 = &local_c0;
        pmVar10 = pmVar9;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          *(undefined4 *)pmVar10->version = *(undefined4 *)pCVar14->version;
          pCVar14 = (CExtPubKey *)((long)pCVar14 + ((ulong)bVar18 * -2 + 1) * 4);
          pmVar10 = (mapped_type *)((long)pmVar10 + (ulong)bVar18 * -8 + 4);
        }
        (pmVar9->pubkey).vch[0x40] = local_c0.pubkey.vch[0x40];
      }
    }
    else {
      local_2ac.version = (uchar  [4])(this->super_PubkeyProvider).m_expr_index;
      pmVar9 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&write_cache->m_parent_xpubs,(key_type *)&local_2ac);
      pCVar14 = &local_134;
      pmVar10 = pmVar9;
      for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
        *(undefined4 *)pmVar10->version = *(undefined4 *)pCVar14->version;
        pCVar14 = (CExtPubKey *)((long)pCVar14 + ((ulong)bVar18 * -2 + 1) * 4);
        pmVar10 = (mapped_type *)((long)pmVar10 + (ulong)bVar18 * -8 + 4);
      }
      (pmVar9->pubkey).vch[0x40] = local_134.pubkey.vch[0x40];
      if (((bVar17 & 0xfe) == 2) || ((bVar17 < 8 && ((0xd0U >> (bVar17 & 0x1f) & 1) != 0)))) {
        local_2ac.version = (uchar  [4])(this->super_PubkeyProvider).m_expr_index;
        pmVar10 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&write_cache->m_last_hardened_xpubs,(key_type *)&local_2ac);
        *(undefined8 *)((pmVar10->chaincode).super_base_blob<256U>.m_data._M_elems + 0x10) =
             local_158._16_8_;
        *(undefined8 *)((pmVar10->chaincode).super_base_blob<256U>.m_data._M_elems + 0x18) =
             local_158._24_8_;
        *(undefined8 *)(pmVar10->chaincode).super_base_blob<256U>.m_data._M_elems = local_158._0_8_;
        *(undefined8 *)((pmVar10->chaincode).super_base_blob<256U>.m_data._M_elems + 8) =
             local_158._8_8_;
        pmVar10->version[0] = (undefined1)local_168;
        pmVar10->version[1] = local_168._1_1_;
        pmVar10->version[2] = local_168._2_1_;
        pmVar10->version[3] = local_168._3_1_;
        pmVar10->nDepth = local_168._4_1_;
        pmVar10->vchFingerprint[0] = local_168._5_1_;
        pmVar10->vchFingerprint[1] = local_168._6_1_;
        pmVar10->vchFingerprint[2] = local_168._7_1_;
        *(undefined8 *)(pmVar10->vchFingerprint + 3) = _uStack_160;
        (pmVar10->pubkey).vch[0] = bVar17;
        *(uchar (*) [8])((pmVar10->pubkey).vch + 1) = local_1b8;
        *(uchar (*) [8])((pmVar10->pubkey).vch + 9) = auStack_1b0;
        *(uchar (*) [8])((pmVar10->pubkey).vch + 0x11) = local_1a8;
        *(uchar (*) [8])((pmVar10->pubkey).vch + 0x19) = auStack_1a0;
        *(uchar (*) [8])((pmVar10->pubkey).vch + 0x21) = local_198;
        *(uchar (*) [8])((pmVar10->pubkey).vch + 0x29) = auStack_190;
        *(uchar (*) [8])((pmVar10->pubkey).vch + 0x31) = local_188;
        *(undefined8 *)((pmVar10->pubkey).vch + 0x39) = uStack_180;
      }
    }
  }
LAB_003903b4:
  if (local_2e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool GetPubKey(int pos, const SigningProvider& arg, CPubKey& key_out, KeyOriginInfo& final_info_out, const DescriptorCache* read_cache = nullptr, DescriptorCache* write_cache = nullptr) const override
    {
        // Info of parent of the to be derived pubkey
        KeyOriginInfo parent_info;
        CKeyID keyid = m_root_extkey.pubkey.GetID();
        std::copy(keyid.begin(), keyid.begin() + sizeof(parent_info.fingerprint), parent_info.fingerprint);
        parent_info.path = m_path;

        // Info of the derived key itself which is copied out upon successful completion
        KeyOriginInfo final_info_out_tmp = parent_info;
        if (m_derive == DeriveType::UNHARDENED) final_info_out_tmp.path.push_back((uint32_t)pos);
        if (m_derive == DeriveType::HARDENED) final_info_out_tmp.path.push_back(((uint32_t)pos) | 0x80000000L);

        // Derive keys or fetch them from cache
        CExtPubKey final_extkey = m_root_extkey;
        CExtPubKey parent_extkey = m_root_extkey;
        CExtPubKey last_hardened_extkey;
        bool der = true;
        if (read_cache) {
            if (!read_cache->GetCachedDerivedExtPubKey(m_expr_index, pos, final_extkey)) {
                if (m_derive == DeriveType::HARDENED) return false;
                // Try to get the derivation parent
                if (!read_cache->GetCachedParentExtPubKey(m_expr_index, parent_extkey)) return false;
                final_extkey = parent_extkey;
                if (m_derive == DeriveType::UNHARDENED) der = parent_extkey.Derive(final_extkey, pos);
            }
        } else if (IsHardened()) {
            CExtKey xprv;
            CExtKey lh_xprv;
            if (!GetDerivedExtKey(arg, xprv, lh_xprv)) return false;
            parent_extkey = xprv.Neuter();
            if (m_derive == DeriveType::UNHARDENED) der = xprv.Derive(xprv, pos);
            if (m_derive == DeriveType::HARDENED) der = xprv.Derive(xprv, pos | 0x80000000UL);
            final_extkey = xprv.Neuter();
            if (lh_xprv.key.IsValid()) {
                last_hardened_extkey = lh_xprv.Neuter();
            }
        } else {
            for (auto entry : m_path) {
                if (!parent_extkey.Derive(parent_extkey, entry)) return false;
            }
            final_extkey = parent_extkey;
            if (m_derive == DeriveType::UNHARDENED) der = parent_extkey.Derive(final_extkey, pos);
            assert(m_derive != DeriveType::HARDENED);
        }
        if (!der) return false;

        final_info_out = final_info_out_tmp;
        key_out = final_extkey.pubkey;

        if (write_cache) {
            // Only cache parent if there is any unhardened derivation
            if (m_derive != DeriveType::HARDENED) {
                write_cache->CacheParentExtPubKey(m_expr_index, parent_extkey);
                // Cache last hardened xpub if we have it
                if (last_hardened_extkey.pubkey.IsValid()) {
                    write_cache->CacheLastHardenedExtPubKey(m_expr_index, last_hardened_extkey);
                }
            } else if (final_info_out.path.size() > 0) {
                write_cache->CacheDerivedExtPubKey(m_expr_index, pos, final_extkey);
            }
        }

        return true;
    }